

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::peekToken(Tokenizer *this,int ahead)

{
  iterator iVar1;
  bool bVar2;
  Token *pTVar3;
  int iVar4;
  bool bVar5;
  iterator it;
  iterator local_28;
  
  local_28._M_node = (this->position).it._M_node;
  iVar4 = 0;
  if (0 < ahead) {
    iVar4 = ahead;
  }
  while( true ) {
    iVar1._M_node = local_28._M_node;
    bVar2 = processElement(this,&local_28);
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    if (!bVar2) goto LAB_001440bb;
    local_28._M_node = (iVar1._M_node)->_M_next;
  }
  if (bVar2) {
    pTVar3 = (Token *)(iVar1._M_node + 1);
  }
  else {
LAB_001440bb:
    pTVar3 = &this->invalidToken;
  }
  return pTVar3;
}

Assistant:

const Token& Tokenizer::peekToken(int ahead)
{
	auto it = position.it;
	for (int i = 0; i < ahead; i++)
	{
		if (!processElement(it))
			return invalidToken;

		++it;
	}
	
	if (!processElement(it))
		return invalidToken;

	return *it;
}